

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVCtrl.c
# Opt level: O0

int XNVCTRLSetTargetAttributeAndGetStatus
              (Display *dpy,int target_type,int target_id,uint display_mask,uint attribute,int value
              )

{
  int iVar1;
  undefined4 in_ECX;
  undefined2 in_DX;
  undefined2 in_SI;
  long in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  int success;
  xnvCtrlSetAttributeAndGetStatusReply rep;
  xnvCtrlSetAttributeAndGetStatusReq *req;
  XExtDisplayInfo *info;
  Display *in_stack_ffffffffffffff98;
  undefined1 local_58 [8];
  int local_50;
  undefined1 *local_38;
  XExtDisplayInfo *local_30;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  undefined2 local_18;
  undefined2 local_14;
  long local_10;
  int local_4;
  
  local_24 = in_R9D;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_10 = in_RDI;
  local_14 = in_SI;
  local_18 = in_DX;
  local_30 = find_display(in_stack_ffffffffffffff98);
  if ((local_30 == (XExtDisplayInfo *)0x0) || (local_30->codes == (XExtCodes *)0x0)) {
    local_4 = 0;
  }
  else if ((local_30 == (XExtDisplayInfo *)0x0) || (local_30->codes == (XExtCodes *)0x0)) {
    XMissingExtension(local_10,nvctrl_extension_name);
    local_4 = 0;
  }
  else {
    if (*(long *)(local_10 + 0x968) != 0) {
      (*(code *)**(undefined8 **)(local_10 + 0x968))(local_10);
    }
    local_38 = (undefined1 *)_XGetRequest(local_10,0x13,0x14);
    *local_38 = (char)local_30->codes->major_opcode;
    local_38[1] = 0x13;
    *(undefined2 *)(local_38 + 6) = local_14;
    *(undefined2 *)(local_38 + 4) = local_18;
    *(undefined4 *)(local_38 + 8) = local_1c;
    *(undefined4 *)(local_38 + 0xc) = local_20;
    *(undefined4 *)(local_38 + 0x10) = local_24;
    iVar1 = _XReply(local_10,local_58,0);
    if (iVar1 == 0) {
      if (*(long *)(local_10 + 0x968) != 0) {
        (**(code **)(*(long *)(local_10 + 0x968) + 8))(local_10);
      }
      if (*(long *)(local_10 + 0xd0) != 0) {
        (**(code **)(local_10 + 0xd0))(local_10);
      }
      local_4 = 0;
    }
    else {
      if (*(long *)(local_10 + 0x968) != 0) {
        (**(code **)(*(long *)(local_10 + 0x968) + 8))(local_10);
      }
      if (*(long *)(local_10 + 0xd0) != 0) {
        (**(code **)(local_10 + 0xd0))(local_10);
      }
      local_4 = local_50;
    }
  }
  return local_4;
}

Assistant:

Bool XNVCTRLSetTargetAttributeAndGetStatus (
    Display *dpy,
    int target_type,
    int target_id,
    unsigned int display_mask,
    unsigned int attribute,
    int value
){
    XExtDisplayInfo *info = find_display (dpy);
    xnvCtrlSetAttributeAndGetStatusReq *req;
    xnvCtrlSetAttributeAndGetStatusReply rep;
    Bool success;

    if(!XextHasExtension(info))
        return False;

    XNVCTRLCheckExtension (dpy, info, False);

    LockDisplay (dpy);
    GetReq (nvCtrlSetAttributeAndGetStatus, req);
    req->reqType = info->codes->major_opcode;
    req->nvReqType = X_nvCtrlSetAttributeAndGetStatus;
    req->target_type = target_type;
    req->target_id = target_id;
    req->display_mask = display_mask;
    req->attribute = attribute;
    req->value = value;
    if (!_XReply (dpy, (xReply *) &rep, 0, False)) {
        UnlockDisplay (dpy);
        SyncHandle ();
        return False;
    }
    UnlockDisplay (dpy);
    SyncHandle ();
    
    success = rep.flags;
    return success;
}